

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall
spirv_cross::ParsedIR::set_member_decoration
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration,uint32_t argument)

{
  unsigned_long *puVar1;
  Decoration *pDVar2;
  Vector<Decoration> *this_00;
  Decoration *dec;
  size_t local_40;
  TypedID<(spirv_cross::Types)0> local_34;
  mapped_type *local_30;
  mapped_type *m;
  Decoration local_20;
  uint32_t argument_local;
  Decoration decoration_local;
  uint32_t index_local;
  ParsedIR *this_local;
  TypeID id_local;
  
  m._4_4_ = argument;
  local_20 = decoration;
  argument_local = index;
  _decoration_local = this;
  this_local._4_4_ = id.id;
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
            (&local_34,(TypedID<(spirv_cross::Types)1> *)((long)&this_local + 4));
  local_30 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&this->meta,&local_34);
  this_00 = &local_30->members;
  local_40 = VectorView<spirv_cross::Meta::Decoration>::size
                       (&this_00->super_VectorView<spirv_cross::Meta::Decoration>);
  dec = (Decoration *)((ulong)argument_local + 1);
  puVar1 = ::std::max<unsigned_long>(&local_40,(unsigned_long *)&dec);
  SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize(this_00,*puVar1);
  pDVar2 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                     (&(local_30->members).super_VectorView<spirv_cross::Meta::Decoration>,
                      (ulong)argument_local);
  Bitset::set(&pDVar2->decoration_flags,local_20);
  switch(local_20) {
  case DecorationSpecId:
    pDVar2->spec_id = m._4_4_;
    break;
  default:
    break;
  case DecorationMatrixStride:
    pDVar2->matrix_stride = m._4_4_;
    break;
  case DecorationBuiltIn:
    pDVar2->builtin = true;
    pDVar2->builtin_type = m._4_4_;
    break;
  case DecorationStream:
    pDVar2->stream = m._4_4_;
    break;
  case DecorationLocation:
    pDVar2->location = m._4_4_;
    break;
  case DecorationComponent:
    pDVar2->component = m._4_4_;
    break;
  case DecorationIndex:
    pDVar2->index = m._4_4_;
    break;
  case DecorationBinding:
    pDVar2->binding = m._4_4_;
    break;
  case DecorationOffset:
    pDVar2->offset = m._4_4_;
    break;
  case DecorationXfbBuffer:
    pDVar2->xfb_buffer = m._4_4_;
    break;
  case DecorationXfbStride:
    pDVar2->xfb_stride = m._4_4_;
  }
  return;
}

Assistant:

void ParsedIR::set_member_decoration(TypeID id, uint32_t index, Decoration decoration, uint32_t argument)
{
	auto &m = meta[id];
	m.members.resize(max(m.members.size(), size_t(index) + 1));
	auto &dec = m.members[index];
	dec.decoration_flags.set(decoration);

	switch (decoration)
	{
	case DecorationBuiltIn:
		dec.builtin = true;
		dec.builtin_type = static_cast<BuiltIn>(argument);
		break;

	case DecorationLocation:
		dec.location = argument;
		break;

	case DecorationComponent:
		dec.component = argument;
		break;

	case DecorationBinding:
		dec.binding = argument;
		break;

	case DecorationOffset:
		dec.offset = argument;
		break;

	case DecorationXfbBuffer:
		dec.xfb_buffer = argument;
		break;

	case DecorationXfbStride:
		dec.xfb_stride = argument;
		break;

	case DecorationStream:
		dec.stream = argument;
		break;

	case DecorationSpecId:
		dec.spec_id = argument;
		break;

	case DecorationMatrixStride:
		dec.matrix_stride = argument;
		break;

	case DecorationIndex:
		dec.index = argument;
		break;

	default:
		break;
	}
}